

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O2

void __thiscall
helics::InterfaceInfo::createPublication
          (InterfaceInfo *this,InterfaceHandle handle,string_view key,string_view type,
          string_view units,uint16_t flags)

{
  pointer this_00;
  allocator<char> local_7d;
  InterfaceHandle handle_local;
  handle cpHandle;
  string_view type_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string_view key_local;
  GlobalHandle local_20;
  
  type_local._M_str = type._M_str;
  type_local._M_len = type._M_len;
  key_local._M_str = key._M_str;
  key_local._M_len = key._M_len;
  handle_local = handle;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(&cpHandle,&this->publications);
  this_00 = cpHandle.data;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,(basic_string_view<char,_std::char_traits<char>_> *)&key_local,
             &local_7d);
  local_20.fed_id.gid = (this->global_id)._M_i.gid;
  local_20.handle.hid = handle_local.hid;
  gmlc::containers::
  DualMappedPointerVector<helics::PublicationInfo,std::__cxx11::string,helics::InterfaceHandle>::
  insert<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((DualMappedPointerVector<helics::PublicationInfo,std::__cxx11::string,helics::InterfaceHandle>
              *)this_00,&local_50,&handle_local,&local_20,&key_local,&type_local,&units);
  std::__cxx11::string::~string((string *)&local_50);
  if ((flags & 4) != 0) {
    PublicationInfo::setProperty
              (((cpHandle.data)->dataStorage).
               super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
               .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl,0x18d,1);
  }
  if ((flags >> 8 & 1) != 0) {
    PublicationInfo::setProperty
              (((cpHandle.data)->dataStorage).
               super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
               .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl,0x192,1);
  }
  if ((flags & 1) != 0) {
    PublicationInfo::setProperty
              (((cpHandle.data)->dataStorage).
               super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
               .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl,0x19b,1);
  }
  if ((flags >> 0xc & 1) != 0) {
    PublicationInfo::setProperty
              (((cpHandle.data)->dataStorage).
               super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
               .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl,0x1c4,1);
  }
  if ((flags & 8) != 0) {
    PublicationInfo::setProperty
              (((cpHandle.data)->dataStorage).
               super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
               .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl,0x197,1);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&cpHandle.m_handle_lock);
  return;
}

Assistant:

void InterfaceInfo::createPublication(InterfaceHandle handle,
                                      std::string_view key,
                                      std::string_view type,
                                      std::string_view units,
                                      std::uint16_t flags)
{
    auto cpHandle = publications.lock();
    cpHandle->insert(std::string(key), handle, GlobalHandle{global_id, handle}, key, type, units);
    if (checkActionFlag(flags, required_flag)) {
        cpHandle->back()->setProperty(defs::Options::CONNECTION_REQUIRED, 1);
    }
    if (checkActionFlag(flags, optional_flag)) {
        cpHandle->back()->setProperty(defs::Options::CONNECTION_OPTIONAL, 1);
    }
    if (checkActionFlag(flags, buffer_data_flag)) {
        cpHandle->back()->setProperty(defs::Options::BUFFER_DATA, 1);
    }
    if (checkActionFlag(flags, only_transmit_on_change_flag)) {
        cpHandle->back()->setProperty(defs::Options::HANDLE_ONLY_TRANSMIT_ON_CHANGE, 1);
    }
    if (checkActionFlag(flags, single_connection_flag)) {
        cpHandle->back()->setProperty(defs::Options::SINGLE_CONNECTION_ONLY, 1);
    }
}